

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

XMLReader * __thiscall
xercesc_4_0::ReaderMgr::createReader
          (ReaderMgr *this,XMLCh *sysId,XMLCh *pubId,bool xmlDecl,RefFrom refFrom,Types type,
          Sources source,InputSource **srcToFill,bool calcSrcOfs,XMLSize_t lowWaterMark,
          bool disableDefaultEntityResolution)

{
  undefined8 baseURL;
  bool bVar1;
  uint uVar2;
  int iVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var;
  InputSource *this_00;
  MalformedURLException *pMVar5;
  URLInputSource *this_01;
  XMLReader *retVal;
  Janitor<xercesc_4_0::InputSource> janSrc;
  XMLBuffer resolvedSysId;
  XMLURL urlTmp;
  LastExtEntityInfo lastInfo_1;
  undefined1 local_118 [8];
  XMLResourceIdentifier resourceIdentifier;
  LastExtEntityInfo lastInfo;
  XMLBuffer expSysId;
  XMLCh *normalizedURI;
  XMLCh local_72;
  undefined1 local_70 [8];
  XMLBuffer normalizedSysId;
  bool disableDefaultEntityResolution_local;
  bool calcSrcOfs_local;
  Types type_local;
  RefFrom refFrom_local;
  bool xmlDecl_local;
  XMLCh *pubId_local;
  XMLCh *sysId_local;
  ReaderMgr *this_local;
  
  normalizedSysId.fBuffer._3_1_ = calcSrcOfs;
  normalizedSysId.fBuffer._2_1_ = disableDefaultEntityResolution;
  normalizedSysId.fBuffer._4_4_ = type;
  XMLBuffer::XMLBuffer((XMLBuffer *)local_70,0x3ff,this->fMemoryManager);
  if (sysId != (XMLCh *)0x0) {
    local_72 = L'\xffff';
    XMLString::removeChar(sysId,&local_72,(XMLBuffer *)local_70);
  }
  pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)local_70);
  XMLBuffer::XMLBuffer((XMLBuffer *)&lastInfo.colNumber,0x3ff,this->fMemoryManager);
  if (this->fEntityHandler == (XMLEntityHandler *)0x0) {
    XMLBuffer::set((XMLBuffer *)&lastInfo.colNumber,pXVar4);
  }
  else {
    uVar2 = (*this->fEntityHandler->_vptr_XMLEntityHandler[3])
                      (this->fEntityHandler,pXVar4,&lastInfo.colNumber);
    if ((uVar2 & 1) == 0) {
      XMLBuffer::set((XMLBuffer *)&lastInfo.colNumber,pXVar4);
    }
  }
  *srcToFill = (InputSource *)0x0;
  if (this->fEntityHandler != (XMLEntityHandler *)0x0) {
    LastExtEntityInfo::LastExtEntityInfo((LastExtEntityInfo *)&resourceIdentifier.fLocator);
    getLastExtEntityInfo(this,(LastExtEntityInfo *)&resourceIdentifier.fLocator);
    pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)&lastInfo.colNumber);
    XMLResourceIdentifier::XMLResourceIdentifier
              ((XMLResourceIdentifier *)local_118,ExternalEntity,pXVar4,L"",pubId,
               (XMLCh *)resourceIdentifier.fLocator,&this->super_Locator);
    iVar3 = (*this->fEntityHandler->_vptr_XMLEntityHandler[5])(this->fEntityHandler,local_118);
    *srcToFill = (InputSource *)CONCAT44(extraout_var,iVar3);
    XMLResourceIdentifier::~XMLResourceIdentifier((XMLResourceIdentifier *)local_118);
  }
  if (*srcToFill == (InputSource *)0x0) {
    if ((normalizedSysId.fBuffer._2_1_ & 1) != 0) {
      this_local = (ReaderMgr *)0x0;
      goto LAB_003643ff;
    }
    LastExtEntityInfo::LastExtEntityInfo((LastExtEntityInfo *)&urlTmp.fHasInvalidChar);
    getLastExtEntityInfo(this,(LastExtEntityInfo *)&urlTmp.fHasInvalidChar);
    XMLURL::XMLURL((XMLURL *)&resolvedSysId.fBuffer,this->fMemoryManager);
    baseURL = urlTmp._80_8_;
    pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)&lastInfo.colNumber);
    bVar1 = XMLURL::setURL((XMLURL *)&resolvedSysId.fBuffer,(XMLCh *)baseURL,pXVar4,
                           (XMLURL *)&resolvedSysId.fBuffer);
    if ((!bVar1) || (bVar1 = XMLURL::isRelative((XMLURL *)&resolvedSysId.fBuffer), bVar1)) {
      if ((this->fStandardUriConformant & 1U) != 0) {
        pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
                   ,0x26e,URL_MalformedURL,this->fMemoryManager);
        __cxa_throw(pMVar5,&MalformedURLException::typeinfo,
                    MalformedURLException::~MalformedURLException);
      }
      XMLBuffer::XMLBuffer((XMLBuffer *)&janSrc,0x3ff,this->fMemoryManager);
      pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)&lastInfo.colNumber);
      XMLUri::normalizeURI(pXVar4,(XMLBuffer *)&janSrc);
      this_00 = (InputSource *)XMemory::operator_new(0x30,this->fMemoryManager);
      pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)&janSrc);
      LocalFileInputSource::LocalFileInputSource
                ((LocalFileInputSource *)this_00,(XMLCh *)urlTmp._80_8_,pXVar4,this->fMemoryManager)
      ;
      *srcToFill = this_00;
      XMLBuffer::~XMLBuffer((XMLBuffer *)&janSrc);
    }
    else {
      if (((this->fStandardUriConformant & 1U) != 0) &&
         (bVar1 = XMLURL::hasInvalidChar((XMLURL *)&resolvedSysId.fBuffer), bVar1)) {
        pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
                   ,0x273,URL_MalformedURL,this->fMemoryManager);
        __cxa_throw(pMVar5,&MalformedURLException::typeinfo,
                    MalformedURLException::~MalformedURLException);
      }
      this_01 = (URLInputSource *)XMemory::operator_new(0x88,this->fMemoryManager);
      URLInputSource::URLInputSource(this_01,(XMLURL *)&resolvedSysId.fBuffer,this->fMemoryManager);
      *srcToFill = (InputSource *)this_01;
    }
    XMLURL::~XMLURL((XMLURL *)&resolvedSysId.fBuffer);
  }
  Janitor<xercesc_4_0::InputSource>::Janitor
            ((Janitor<xercesc_4_0::InputSource> *)&retVal,*srcToFill);
  this_local = (ReaderMgr *)
               createReader(this,*srcToFill,xmlDecl,refFrom,normalizedSysId.fBuffer._4_4_,source,
                            (bool)(normalizedSysId.fBuffer._3_1_ & 1),lowWaterMark);
  Janitor<xercesc_4_0::InputSource>::orphan((Janitor<xercesc_4_0::InputSource> *)&retVal);
  if ((XMLReader *)this_local == (XMLReader *)0x0) {
    this_local = (ReaderMgr *)0x0;
  }
  else {
    uVar2 = this->fNextReaderNum;
    this->fNextReaderNum = uVar2 + 1;
    XMLReader::setReaderNum((XMLReader *)this_local,(ulong)uVar2);
  }
  Janitor<xercesc_4_0::InputSource>::~Janitor((Janitor<xercesc_4_0::InputSource> *)&retVal);
LAB_003643ff:
  XMLBuffer::~XMLBuffer((XMLBuffer *)&lastInfo.colNumber);
  XMLBuffer::~XMLBuffer((XMLBuffer *)local_70);
  return (XMLReader *)this_local;
}

Assistant:

XMLReader* ReaderMgr::createReader( const   XMLCh* const        sysId
                                    , const XMLCh* const        pubId
                                    , const bool                xmlDecl
                                    , const XMLReader::RefFrom  refFrom
                                    , const XMLReader::Types    type
                                    , const XMLReader::Sources  source
                                    ,       InputSource*&       srcToFill
                                    , const bool                calcSrcOfs
                                    ,       XMLSize_t           lowWaterMark
                                    , const bool                disableDefaultEntityResolution)
{
    //Normalize sysId
    XMLBuffer normalizedSysId(1023, fMemoryManager);
    if(sysId)
        XMLString::removeChar(sysId, 0xFFFF, normalizedSysId);
    const XMLCh* normalizedURI = normalizedSysId.getRawBuffer();

    // Create a buffer for expanding the system id
    XMLBuffer expSysId(1023, fMemoryManager);

    //
    //  Allow the entity handler to expand the system id if they choose
    //  to do so.
    //
    if (fEntityHandler)
    {
        if (!fEntityHandler->expandSystemId(normalizedURI, expSysId))
            expSysId.set(normalizedURI);
    }
     else
    {
        expSysId.set(normalizedURI);
    }

    // Call the entity resolver interface to get an input source
    srcToFill = 0;
    if (fEntityHandler)
    {
        LastExtEntityInfo lastInfo;
        getLastExtEntityInfo(lastInfo);
        XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::ExternalEntity,
                            expSysId.getRawBuffer(), XMLUni::fgZeroLenString, pubId, lastInfo.systemId,
                            this);
        srcToFill = fEntityHandler->resolveEntity(&resourceIdentifier);
    }

    //
    //  If they didn't create a source via the entity resolver, then we
    //  have to create one on our own.
    //
    if (!srcToFill)
    {
        if (disableDefaultEntityResolution)
            return 0;

        LastExtEntityInfo lastInfo;
        getLastExtEntityInfo(lastInfo);

// Keep this #if 0 block as it was exposing a threading problem on AIX.
// Got rid of the problem by changing XMLURL to not throw malformedurl
// exceptions.
#if 0
        try
        {
            XMLURL urlTmp(lastInfo.systemId, expSysId.getRawBuffer(), fMemoryManager);
            if (urlTmp.isRelative())
            {
                ThrowXMLwithMemMgr
                (
                    MalformedURLException
                    , XMLExcepts::URL_NoProtocolPresent
                    , fMemoryManager
                );
            }
            else {
                if (fStandardUriConformant && urlTmp.hasInvalidChar())
                    ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
                srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
            }
        }

        catch(const MalformedURLException& e)
        {
            // Its not a URL, so lets assume its a local file name if non-standard uri is allowed
            if (!fStandardUriConformant)
                srcToFill = new (fMemoryManager) LocalFileInputSource
                (
                    lastInfo.systemId
                    , expSysId.getRawBuffer()
                    , fMemoryManager
                );
            else
                throw e;
        }
#else
        XMLURL urlTmp(fMemoryManager);
        if ((!urlTmp.setURL(lastInfo.systemId, expSysId.getRawBuffer(), urlTmp)) ||
            (urlTmp.isRelative()))
        {
            if (!fStandardUriConformant)
            {
                XMLBuffer resolvedSysId(1023, fMemoryManager);
                XMLUri::normalizeURI(expSysId.getRawBuffer(), resolvedSysId);

                srcToFill = new (fMemoryManager) LocalFileInputSource
                (
                    lastInfo.systemId
                    , resolvedSysId.getRawBuffer()
                    , fMemoryManager
                );
            }
            else
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
        }
        else
        {
            if (fStandardUriConformant && urlTmp.hasInvalidChar())
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
            srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
        }
#endif
    }

    // Put a janitor on the input source
    Janitor<InputSource> janSrc(srcToFill);

    //
    //  Now call the other version with the input source that we have, and
    //  return the resulting reader.
    //
    XMLReader* retVal = createReader
    (
        *srcToFill
        , xmlDecl
        , refFrom
        , type
        , source
        , calcSrcOfs
        , lowWaterMark
    );

    // Either way, we can release the input source now
    janSrc.orphan();

    // If it failed for any reason, then return zero.
    if (!retVal)
        return 0;

    // Give this reader the next available reader number and return it
    retVal->setReaderNum(fNextReaderNum++);
    return retVal;
}